

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O1

void __thiscall Process::DupFd(Process *this,int from,int to)

{
  ulong uVar1;
  runtime_error *this_00;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  FDInfo info;
  int local_6c;
  FDInfo local_68;
  string local_38;
  
  uVar1 = (this->files_)._M_h._M_bucket_count;
  uVar2 = (ulong)(long)from % uVar1;
  p_Var4 = (this->files_)._M_h._M_buckets[uVar2];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var4->_M_nxt, p_Var5 = p_Var4, *(int *)&p_Var4->_M_nxt[1]._M_nxt != from)) {
    while (p_Var4 = p_Var3, p_Var3 = p_Var4->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % uVar1 != uVar2) ||
         (p_Var5 = p_Var4, *(int *)&p_Var3[1]._M_nxt == from)) goto LAB_0010b090;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0010b090:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var5->_M_nxt;
  }
  local_6c = to;
  if (p_Var3 == (_Hash_node_base *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_38,from);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                   "Unknown file descriptor: ",&local_38);
    std::runtime_error::runtime_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  FDInfo::FDInfo(&local_68,to,(path *)(p_Var3 + 3),false);
  uVar1 = (this->files_)._M_h._M_bucket_count;
  uVar2 = (ulong)(long)local_6c % uVar1;
  p_Var4 = (this->files_)._M_h._M_buckets[uVar2];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var4->_M_nxt, p_Var5 = p_Var4, local_6c != *(int *)&p_Var4->_M_nxt[1]._M_nxt)) {
    while (p_Var4 = p_Var3, p_Var3 = p_Var4->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % uVar1 != uVar2) ||
         (p_Var5 = p_Var4, local_6c == *(int *)&p_Var3[1]._M_nxt)) goto LAB_0010b115;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0010b115:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var5->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    std::
    _Hashtable<int,std::pair<int_const,FDInfo>,std::allocator<std::pair<int_const,FDInfo>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<int&,FDInfo&>
              ((_Hashtable<int,std::pair<int_const,FDInfo>,std::allocator<std::pair<int_const,FDInfo>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->files_,&local_6c,&local_68);
  }
  else {
    *(int *)&p_Var3[2]._M_nxt = local_68.Fd;
    std::__cxx11::string::_M_assign((string *)(p_Var3 + 3));
    *(undefined2 *)&p_Var3[7]._M_nxt = local_68._40_2_;
  }
  FDInfo::~FDInfo(&local_68);
  return;
}

Assistant:

void Process::DupFd(int from, int to)
{
  auto it = files_.find(from);
  if (it == files_.end()) {
    throw std::runtime_error(
        "Unknown file descriptor: " + std::to_string(from)
    );
  }

  const auto &oldInfo = it->second;
  FDInfo info(to, oldInfo.Path, false);

  auto jt = files_.find(to);
  if (jt == files_.end()) {
    files_.emplace(to, info);
  } else {
    jt->second = info;
  }
}